

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

error_code __thiscall
std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>::
set_option<std::experimental::net::v1::detail::socket_option::boolean<1,2>>
          (reactive_socket_service<std::experimental::net::v1::ip::tcp> *this,
          implementation_type *impl,boolean<1,_2> *option,error_code *ec)

{
  int iVar1;
  uint *puVar2;
  error_category *peVar3;
  uint uVar4;
  error_code eVar5;
  
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    peVar3 = (error_category *)std::_V2::system_category();
    ec->_M_value = 9;
    ec->_M_cat = peVar3;
    uVar4 = 9;
  }
  else {
    puVar2 = (uint *)__errno_location();
    *puVar2 = 0;
    iVar1 = setsockopt(iVar1,1,2,option,4);
    uVar4 = *puVar2;
    peVar3 = (error_category *)std::_V2::system_category();
    ec->_M_value = uVar4;
    ec->_M_cat = peVar3;
    if (iVar1 == 0) {
      ec->_M_value = 0;
      uVar4 = 0;
    }
  }
  eVar5._4_4_ = 0;
  eVar5._M_value = uVar4;
  eVar5._M_cat = peVar3;
  return eVar5;
}

Assistant:

std::error_code set_option(implementation_type& impl,
      const Option& option, std::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }